

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O1

PerOperationSamplingStrategies * __thiscall
jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::operator=
          (PerOperationSamplingStrategies *this,PerOperationSamplingStrategies *other13)

{
  this->defaultSamplingProbability = other13->defaultSamplingProbability;
  this->defaultLowerBoundTracesPerSecond = other13->defaultLowerBoundTracesPerSecond;
  std::
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ::operator=(&this->perOperationStrategies,&other13->perOperationStrategies);
  this->defaultUpperBoundTracesPerSecond = other13->defaultUpperBoundTracesPerSecond;
  this->__isset = other13->__isset;
  return this;
}

Assistant:

PerOperationSamplingStrategies& PerOperationSamplingStrategies::operator=(const PerOperationSamplingStrategies& other13) {
  defaultSamplingProbability = other13.defaultSamplingProbability;
  defaultLowerBoundTracesPerSecond = other13.defaultLowerBoundTracesPerSecond;
  perOperationStrategies = other13.perOperationStrategies;
  defaultUpperBoundTracesPerSecond = other13.defaultUpperBoundTracesPerSecond;
  __isset = other13.__isset;
  return *this;
}